

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

size_t __thiscall
flexbuffers::Builder::CreateBlob(Builder *this,void *data,size_t len,size_t trailing,Type type)

{
  byte bVar1;
  anon_union_8_3_83789bcb_for_Value_0 aVar2;
  BitWidth alignment;
  anon_union_8_3_83789bcb_for_Value_0 local_40;
  Type local_38;
  BitWidth local_34;
  
  alignment = BIT_WIDTH_8;
  if (0xff < len) {
    if (len < 0x10000) {
      alignment = BIT_WIDTH_16;
    }
    else {
      alignment = BIT_WIDTH_64 - (len >> 0x20 == 0);
    }
  }
  bVar1 = Align(this,alignment);
  Write<unsigned_long>(this,len,(ulong)bVar1);
  aVar2.i_ = (long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  WriteBytes(this,data,trailing + len);
  local_40.i_ = aVar2.i_;
  local_38 = type;
  local_34 = alignment;
  std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::
  emplace_back<flexbuffers::Builder::Value>(&this->stack_,(Value *)&local_40);
  return aVar2.i_;
}

Assistant:

size_t CreateBlob(const void *data, size_t len, size_t trailing, Type type) {
    auto bit_width = WidthU(len);
    auto byte_width = Align(bit_width);
    Write<uint64_t>(len, byte_width);
    auto sloc = buf_.size();
    WriteBytes(data, len + trailing);
    stack_.push_back(Value(static_cast<uint64_t>(sloc), type, bit_width));
    return sloc;
  }